

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O0

void Gia_ObjTerSimAnd(Gia_Obj_t *pObj)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pObj_local;
  
  iVar1 = Gia_ObjIsAnd(pObj);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x33d,"void Gia_ObjTerSimAnd(Gia_Obj_t *)");
  }
  pGVar2 = Gia_ObjFanin0(pObj);
  iVar1 = Gia_ObjTerSimGetC(pGVar2);
  if (iVar1 == 0) {
    pGVar2 = Gia_ObjFanin1(pObj);
    iVar1 = Gia_ObjTerSimGetC(pGVar2);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjTerSimGet0Fanin0(pObj);
      if ((iVar1 == 0) && (iVar1 = Gia_ObjTerSimGet0Fanin1(pObj), iVar1 == 0)) {
        iVar1 = Gia_ObjTerSimGet1Fanin0(pObj);
        if ((iVar1 == 0) || (iVar1 = Gia_ObjTerSimGet1Fanin1(pObj), iVar1 == 0)) {
          Gia_ObjTerSimSetX(pObj);
        }
        else {
          Gia_ObjTerSimSet1(pObj);
        }
      }
      else {
        Gia_ObjTerSimSet0(pObj);
      }
      return;
    }
    __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin1(pObj) )",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x33f,"void Gia_ObjTerSimAnd(Gia_Obj_t *)");
  }
  __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin0(pObj) )",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x33e,"void Gia_ObjTerSimAnd(Gia_Obj_t *)");
}

Assistant:

static inline void Gia_ObjTerSimAnd( Gia_Obj_t * pObj )
{
    assert( Gia_ObjIsAnd(pObj) );
    assert( !Gia_ObjTerSimGetC( Gia_ObjFanin0(pObj) ) );
    assert( !Gia_ObjTerSimGetC( Gia_ObjFanin1(pObj) ) );
    if ( Gia_ObjTerSimGet0Fanin0(pObj) || Gia_ObjTerSimGet0Fanin1(pObj) )
        Gia_ObjTerSimSet0( pObj );
    else if ( Gia_ObjTerSimGet1Fanin0(pObj) && Gia_ObjTerSimGet1Fanin1(pObj) )
        Gia_ObjTerSimSet1( pObj );
    else 
        Gia_ObjTerSimSetX( pObj );
}